

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combination.c
# Opt level: O2

int generateCombinatorialStabilExhaust
              (Aig_Man_t *pAigNew,Aig_Man_t *pAigOld,Vec_Ptr_t *vDisj_nCk_,int combN,int combK)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  void *pvVar3;
  int iVar4;
  Aig_Obj_t *p1;
  int local_44;
  
  p = Vec_IntAlloc(combK + 3);
  for (iVar4 = -1; iVar4 < combK; iVar4 = iVar4 + 1) {
    Vec_IntPush(p,iVar4);
  }
  Vec_IntPush(p,combN);
  local_44 = 0;
  Vec_IntPush(p,0);
  while( true ) {
    p1 = (Aig_Obj_t *)((ulong)pAigNew->pConst1 ^ 1);
    for (iVar4 = combK; 0 < iVar4; iVar4 = iVar4 + -1) {
      iVar1 = Vec_IntEntry(p,iVar4);
      pvVar3 = Vec_PtrEntry(pAigOld->vCis,(iVar1 + pAigOld->nObjs[2]) - pAigOld->nRegs);
      p1 = Aig_Or(pAigNew,*(Aig_Obj_t **)((long)pvVar3 + 0x28),p1);
    }
    Vec_PtrPush(vDisj_nCk_,p1);
    iVar4 = 1;
    while( true ) {
      iVar1 = Vec_IntEntry(p,iVar4);
      iVar2 = Vec_IntEntry(p,iVar4 + 1);
      if (iVar1 + 1 != iVar2) break;
      Vec_IntWriteEntry(p,iVar4,iVar4 + -1);
      iVar4 = iVar4 + 1;
    }
    local_44 = local_44 + 1;
    if (combK < iVar4) break;
    iVar1 = Vec_IntEntry(p,iVar4);
    Vec_IntWriteEntry(p,iVar4,iVar1 + 1);
  }
  Vec_IntFree(p);
  return local_44;
}

Assistant:

int generateCombinatorialStabilExhaust( Aig_Man_t *pAigNew, Aig_Man_t *pAigOld, 
				Vec_Ptr_t *vDisj_nCk_,
				int combN, int combK )
{
	Aig_Obj_t *pObjMonoCand, *pObj;
	int targetPoIndex;

	//Knuth's Data Strcuture
	int totalCombination_KNUTH = 0;
	Vec_Int_t *vC_KNUTH;
	int i_KNUTH, j_KNUTH;

	//Knuth's Data Structure Initialization
	vC_KNUTH = Vec_IntAlloc(combK+3);
	for(i_KNUTH=-1; i_KNUTH<combK; i_KNUTH++)
		Vec_IntPush( vC_KNUTH, i_KNUTH );
	Vec_IntPush( vC_KNUTH, combN );
	Vec_IntPush( vC_KNUTH, 0 );

	while(1)
	{
		totalCombination_KNUTH++;
		pObjMonoCand = Aig_Not(Aig_ManConst1(pAigNew));
		for( i_KNUTH=combK; i_KNUTH>0; i_KNUTH--)
		{
			//targetPoIndex = Vec_IntEntry( vCandidateMonotoneSignals_, Vec_IntEntry(vC_KNUTH, i_KNUTH));
			targetPoIndex = Vec_IntEntry(vC_KNUTH, i_KNUTH);
			pObj = (Aig_Obj_t *)(Aig_ManLo( pAigOld, targetPoIndex )->pData);
			pObjMonoCand = Aig_Or( pAigNew, pObj, pObjMonoCand );
		}
		Vec_PtrPush(vDisj_nCk_, pObjMonoCand );

		j_KNUTH = 1;
		while( Vec_IntEntry( vC_KNUTH, j_KNUTH ) + 1 == Vec_IntEntry( vC_KNUTH, j_KNUTH+1 ) )
		{
			Vec_IntWriteEntry( vC_KNUTH, j_KNUTH, j_KNUTH-1 );
			j_KNUTH = j_KNUTH + 1;
		}
		if( j_KNUTH > combK ) break;
		Vec_IntWriteEntry( vC_KNUTH, j_KNUTH, Vec_IntEntry( vC_KNUTH, j_KNUTH ) + 1 );
	}

	Vec_IntFree(vC_KNUTH);

	return totalCombination_KNUTH;
}